

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupSimpleStringInternalCache::
~TEST_GROUP_CppUTestGroupSimpleStringInternalCache
          (TEST_GROUP_CppUTestGroupSimpleStringInternalCache *this)

{
  TEST_GROUP_CppUTestGroupSimpleStringInternalCache *this_local;
  
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleStringInternalCache_003f7820;
  TestTestingFixture::~TestTestingFixture(&this->fixture);
  TestFunctionWithCache::~TestFunctionWithCache(&this->testFunction);
  MemoryAccountant::~MemoryAccountant(&this->accountant);
  SimpleStringInternalCache::~SimpleStringInternalCache(&this->cache);
  Utest::~Utest(&this->super_Utest);
  return;
}

Assistant:

TEST_GROUP(SimpleStringInternalCache)
{
    SimpleStringInternalCache cache;
    MemoryAccountant accountant;
    MemoryLeakAllocator* defaultAllocator;
    AccountingTestMemoryAllocator* allocator;

    TestFunctionWithCache testFunction;
    TestTestingFixture fixture;

    void setup() _override
    {
        fixture.setTestFunction(&testFunction);
        testFunction.parameter = &cache;

        defaultAllocator = new MemoryLeakAllocator(defaultMallocAllocator());
        allocator = new AccountingTestMemoryAllocator(accountant, defaultAllocator);
        cache.setAllocator(defaultAllocator);
    }

    void teardown() _override
    {
        cache.clearAllIncludingCurrentlyUsedMemory();
        accountant.clear();
        delete allocator;
        delete defaultAllocator;
    }

    void createCacheForSize(size_t size, size_t amount)
    {
        for (size_t i = 0; i < amount; i++) {
            char* memory = cache.alloc(size);
            cache.dealloc(memory, size);
        }
    }
}